

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_ext.c
# Opt level: O3

void light_write_packet(light_pcapng_t *pcapng,light_packet_header *packet_header,
                       uint8_t *packet_data)

{
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  ushort uVar4;
  uint32_t *puVar5;
  long lVar6;
  light_pcapng next_block;
  light_option option;
  size_t sVar7;
  size_t __size;
  size_t blocks_memory_size;
  light_pcapng local_48;
  size_t local_38;
  
  if (pcapng == (light_pcapng_t *)0x0) {
    light_write_packet_cold_4();
  }
  else if (packet_header == (light_packet_header *)0x0) {
    light_write_packet_cold_3();
  }
  else if (packet_data == (uint8_t *)0x0) {
    light_write_packet_cold_2();
  }
  else if (pcapng->file == (__fd_t)0x0) {
    light_write_packet_cold_1();
  }
  else {
    sVar3 = pcapng->file_info->interface_block_count;
    if (sVar3 == 0) {
      uVar4 = packet_header->data_link;
    }
    else {
      uVar4 = packet_header->data_link;
      sVar7 = 0;
      do {
        if (pcapng->file_info->link_types[sVar7] == uVar4) {
          local_48 = (light_pcapng)0x0;
          goto LAB_001031fc;
        }
        sVar7 = sVar7 + 1;
      } while (sVar3 != sVar7);
    }
    local_38 = (size_t)uVar4;
    local_48 = light_alloc_block(1,(uint32_t *)&local_38,0x14);
    light_add_block(pcapng->pcapng_iter,local_48);
    pcapng->pcapng_iter = local_48;
    __append_interface_block_to_file_info(local_48,pcapng->file_info);
    sVar7 = sVar3;
LAB_001031fc:
    uVar2 = packet_header->captured_length;
    uVar1 = (ulong)uVar2 + 0x14;
    __size = (uVar1 & 0xfffffffffffffffc) + 4;
    if ((uVar2 & 3) == 0) {
      __size = uVar1;
    }
    puVar5 = (uint32_t *)calloc(1,__size);
    *puVar5 = (uint32_t)sVar7;
    lVar6 = (packet_header->timestamp).tv_sec * 1000000 + (packet_header->timestamp).tv_usec;
    puVar5[1] = (uint32_t)((ulong)lVar6 >> 0x20);
    puVar5[2] = (uint32_t)lVar6;
    puVar5[3] = uVar2;
    puVar5[4] = packet_header->original_length;
    memcpy(puVar5 + 5,packet_data,(ulong)uVar2);
    next_block = light_alloc_block(6,puVar5,(int)__size + 0xc);
    light_add_block(pcapng->pcapng_iter,next_block);
    free(puVar5);
    if (packet_header->comment_length != 0) {
      option = light_create_option(1,packet_header->comment_length,packet_header->comment);
      light_add_option((light_pcapng)0x0,next_block,option,LIGHT_FALSE);
    }
    pcapng->pcapng_iter = next_block;
    if (local_48 != (light_pcapng)0x0) {
      next_block = local_48;
    }
    local_38 = 0;
    puVar5 = light_pcapng_to_memory(next_block,&local_38);
    light_write(pcapng->file,puVar5,local_38);
    free(puVar5);
  }
  return;
}

Assistant:

void light_write_packet(light_pcapng_t *pcapng, const light_packet_header *packet_header, const uint8_t *packet_data)
{
	DCHECK_NULLP(pcapng, return);
	DCHECK_NULLP(packet_header, return);
	DCHECK_NULLP(packet_data, return);
	DCHECK_ASSERT_EXP(__is_open_for_write(pcapng) == LIGHT_TRUE, "file not open for writing", return);

	size_t iface_id = 0;
	for (iface_id = 0; iface_id < pcapng->file_info->interface_block_count; iface_id++)
	{
		if (pcapng->file_info->link_types[iface_id] == packet_header->data_link)
			break;
	}

	light_pcapng blocks_to_write = NULL;

	if (iface_id >= pcapng->file_info->interface_block_count)
	{
		struct _light_interface_description_block interface_block;
		interface_block.link_type = packet_header->data_link;
		interface_block.reserved = 0;
		interface_block.snapshot_length = 0;

		light_pcapng iface_block_pcapng = light_alloc_block(LIGHT_INTERFACE_BLOCK, (const uint32_t*)&interface_block, sizeof(struct _light_interface_description_block)+3*sizeof(uint32_t));
		light_add_block(pcapng->pcapng_iter, iface_block_pcapng);
		pcapng->pcapng_iter = iface_block_pcapng;

		blocks_to_write = iface_block_pcapng;
		__append_interface_block_to_file_info(iface_block_pcapng, pcapng->file_info);
	}

	size_t option_size = sizeof(struct _light_enhanced_packet_block) + packet_header->captured_length;
	PADD32(option_size, &option_size);
	uint8_t *epb_memory = calloc(1, option_size);
	memset(epb_memory, 0, option_size);
	struct _light_enhanced_packet_block *epb = (struct _light_enhanced_packet_block *)epb_memory;
	epb->interface_id = iface_id;
	uint64_t timestamp_usec = (uint64_t)packet_header->timestamp.tv_sec * (uint64_t)1000000 + (uint64_t)packet_header->timestamp.tv_usec;
	epb->timestamp_high = timestamp_usec >> 32;
	epb->timestamp_low = timestamp_usec & 0xFFFFFFFF;
	epb->capture_packet_length = packet_header->captured_length;
	epb->original_capture_length = packet_header->original_length;

	memcpy(epb->packet_data, packet_data, packet_header->captured_length);

//	int i = 0;
//
//	for (i = 0; i < packet_header->captured_length; i++)
//	{
//		if (i % 4 == 0)
//			printf("  ");
//
//		printf("0x%X ", packet_data[i]);
//	}
//
//	printf("\n\n\n");
//
//	for (i = 0; i < sizeof(struct _light_enhanced_packet_block) + packet_header->captured_length; i++)
//	{
//		if (i % 4 == 0)
//			printf("  ");
//
//		printf("0x%X ", epb_memory[i]);
//	}


	light_pcapng packet_block_pcapng = light_alloc_block(LIGHT_ENHANCED_PACKET_BLOCK, (const uint32_t*)epb_memory, option_size+3*sizeof(uint32_t));
	light_add_block(pcapng->pcapng_iter, packet_block_pcapng);
	free(epb_memory);

	if (packet_header->comment_length > 0)
	{
		light_option packet_comment_opt = light_create_option(LIGHT_OPTION_COMMENT, packet_header->comment_length, packet_header->comment);
		light_add_option(NULL, packet_block_pcapng, packet_comment_opt, LIGHT_FALSE);
	}

	pcapng->pcapng_iter = packet_block_pcapng;

	if (blocks_to_write == NULL)
		blocks_to_write = packet_block_pcapng;

	size_t blocks_memory_size = 0;
	uint32_t *file_memory = light_pcapng_to_memory(blocks_to_write, &blocks_memory_size);
	light_write(pcapng->file, file_memory, blocks_memory_size);
	free(file_memory);
}